

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.h
# Opt level: O0

void __thiscall
llvm::DWARFExpression::iterator::iterator(iterator *this,DWARFExpression *Expr,uint64_t Offset)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  byte local_49;
  StringRef local_30;
  ulong local_20;
  uint64_t Offset_local;
  DWARFExpression *Expr_local;
  iterator *this_local;
  
  this->Expr = Expr;
  this->Offset = Offset;
  local_20 = Offset;
  Offset_local = (uint64_t)Expr;
  Expr_local = (DWARFExpression *)this;
  Operation::Operation(&this->Op);
  uVar1 = local_20;
  local_30 = DataExtractor::getData((DataExtractor *)Offset_local);
  sVar3 = StringRef::size(&local_30);
  local_49 = 1;
  if (uVar1 < sVar3) {
    bVar2 = Operation::extract(&this->Op,*(DataExtractor *)Offset_local,
                               *(uint16_t *)(Offset_local + 0x18),*(uint8_t *)(Offset_local + 0x1a),
                               local_20);
    local_49 = bVar2 ^ 0xff;
  }
  (this->Op).Error = (bool)(local_49 & 1);
  return;
}

Assistant:

iterator(const DWARFExpression *Expr, uint64_t Offset)
        : Expr(Expr), Offset(Offset) {
      Op.Error =
          Offset >= Expr->Data.getData().size() ||
          !Op.extract(Expr->Data, Expr->Version, Expr->AddressSize, Offset);
    }